

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c++
# Opt level: O0

double __thiscall
kj::parse::_::ParseFloat::operator()
          (ParseFloat *this,Array<char> *digits,Maybe<kj::Array<char>_> *fraction,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *exponent)

{
  bool bVar1;
  Array<char> *pAVar2;
  size_t sVar3;
  Tuple<kj::Maybe<char>,_kj::Array<char>_> *pTVar4;
  TypeByIndex<0UL,_kj::Maybe<char>,_kj::Array<char>_> *pTVar5;
  TypeByIndex<1UL,_kj::Maybe<char>,_kj::Array<char>_> *pTVar6;
  undefined1 *size;
  char *pcVar7;
  Array<char> *__dest;
  double dVar8;
  ArrayPtr<char> AVar9;
  StringPtr local_1a8;
  Fault local_198;
  Fault f_2;
  char **local_188;
  undefined1 local_180 [8];
  DebugComparison<char_*&,_char_*> _kjCondition;
  char *sign;
  char *_sign54;
  Tuple<kj::Maybe<char>,_kj::Array<char>_> *e_1;
  Tuple<kj::Maybe<char>,_kj::Array<char>_> *_e52;
  Array<char> *f_1;
  Array<char> *_f47;
  char *pos;
  undefined1 local_110 [8];
  ArrayPtr<char> buf;
  Array<char> buf_heap;
  char buf_stack [128];
  bool buf_isOnStack;
  size_t buf_size;
  Tuple<kj::Maybe<char>,_kj::Array<char>_> *e;
  Tuple<kj::Maybe<char>,_kj::Array<char>_> *_e38;
  Array<char> *f;
  Array<char> *_f35;
  size_t bufSize;
  Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *exponent_local;
  Maybe<kj::Array<char>_> *fraction_local;
  Array<char> *digits_local;
  ParseFloat *this_local;
  
  _f35 = (Array<char> *)Array<char>::size(digits);
  pAVar2 = kj::_::readMaybe<kj::Array<char>>(fraction);
  if (pAVar2 != (Array<char> *)0x0) {
    sVar3 = Array<char>::size(pAVar2);
    _f35 = (Array<char> *)((long)&_f35->ptr + sVar3 + 1);
  }
  pTVar4 = kj::_::readMaybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>(exponent);
  if (pTVar4 != (Tuple<kj::Maybe<char>,_kj::Array<char>_> *)0x0) {
    pTVar5 = get<0ul,kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>const&>(pTVar4);
    bVar1 = Maybe<char>::operator==(pTVar5);
    pTVar6 = get<1ul,kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>const&>(pTVar4);
    sVar3 = Array<char>::size(pTVar6);
    _f35 = (Array<char> *)((long)&_f35->ptr + (long)(int)(((bVar1 ^ 0xffU) & 1) + 1) + sVar3);
  }
  size = (undefined1 *)((long)&_f35->ptr + 1);
  if (size < (undefined1 *)0x81) {
    Array<char>::Array((Array<char> *)&buf.size_,(void *)0x0);
    AVar9 = arrayPtr<char>((char *)&buf_heap.disposer,(size_t)size);
  }
  else {
    heapArray<char>((Array<char> *)&buf.size_,(size_t)size);
    AVar9 = kj::Array::operator_cast_to_ArrayPtr((Array *)&buf.size_);
  }
  buf.ptr = (char *)AVar9.size_;
  local_110 = (undefined1  [8])AVar9.ptr;
  pAVar2 = (Array<char> *)ArrayPtr<char>::begin((ArrayPtr<char> *)local_110);
  _f47 = pAVar2;
  pcVar7 = Array<char>::begin(digits);
  sVar3 = Array<char>::size(digits);
  memcpy(pAVar2,pcVar7,sVar3);
  sVar3 = Array<char>::size(digits);
  _f47 = (Array<char> *)((long)&_f47->ptr + sVar3);
  pAVar2 = kj::_::readMaybe<kj::Array<char>>(fraction);
  if (pAVar2 != (Array<char> *)0x0) {
    __dest = (Array<char> *)((long)&_f47->ptr + 1);
    *(undefined1 *)&_f47->ptr = 0x2e;
    _f47 = __dest;
    pcVar7 = Array<char>::begin(pAVar2);
    sVar3 = Array<char>::size(pAVar2);
    memcpy(__dest,pcVar7,sVar3);
    sVar3 = Array<char>::size(pAVar2);
    _f47 = (Array<char> *)((long)&_f47->ptr + sVar3);
  }
  pTVar4 = kj::_::readMaybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>(exponent);
  if (pTVar4 != (Tuple<kj::Maybe<char>,_kj::Array<char>_> *)0x0) {
    *(undefined1 *)&_f47->ptr = 0x65;
    _f47 = (Array<char> *)((long)&_f47->ptr + 1);
    pTVar5 = get<0ul,kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>const&>(pTVar4);
    pcVar7 = kj::_::readMaybe<char>(pTVar5);
    if (pcVar7 != (char *)0x0) {
      *(char *)&_f47->ptr = *pcVar7;
      _kjCondition._32_8_ = pcVar7;
      _f47 = (Array<char> *)((long)&_f47->ptr + 1);
    }
    pAVar2 = _f47;
    pTVar6 = get<1ul,kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>const&>(pTVar4);
    pcVar7 = Array<char>::begin(pTVar6);
    pTVar6 = get<1ul,kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>const&>(pTVar4);
    sVar3 = Array<char>::size(pTVar6);
    memcpy(pAVar2,pcVar7,sVar3);
    pTVar6 = get<1ul,kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>const&>(pTVar4);
    sVar3 = Array<char>::size(pTVar6);
    _f47 = (Array<char> *)((long)&_f47->ptr + sVar3);
  }
  *(undefined1 *)&_f47->ptr = 0;
  _f47 = (Array<char> *)((long)&_f47->ptr + 1);
  local_188 = (char **)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char **)&_f47);
  f_2.exception = (Exception *)ArrayPtr<char>::end((ArrayPtr<char> *)local_110);
  kj::_::DebugExpression<char*&>::operator==
            ((DebugComparison<char_*&,_char_*> *)local_180,(DebugExpression<char*&> *)&local_188,
             (char **)&f_2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_180);
  if (bVar1) {
    pcVar7 = ArrayPtr<char>::begin((ArrayPtr<char> *)local_110);
    StringPtr::StringPtr(&local_1a8,pcVar7,(size_t)_f35);
    dVar8 = StringPtr::parseAs<double>(&local_1a8);
    Array<char>::~Array((Array<char> *)&buf.size_);
    return dVar8;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/parse/char.c++"
             ,0x3e,FAILED,"pos == buf.end()","_kjCondition,",
             (DebugComparison<char_*&,_char_*> *)local_180);
  kj::_::Debug::Fault::fatal(&local_198);
}

Assistant:

double ParseFloat::operator()(const Array<char>& digits,
                              const Maybe<Array<char>>& fraction,
                              const Maybe<Tuple<Maybe<char>, Array<char>>>& exponent) const {
  size_t bufSize = digits.size();
  KJ_IF_SOME(f, fraction) {
    bufSize += 1 + f.size();
  }
  KJ_IF_SOME(e, exponent) {
    bufSize += 1 + (get<0>(e) != kj::none) + get<1>(e).size();
  }

  KJ_STACK_ARRAY(char, buf, bufSize + 1, 128, 128);

  char* pos = buf.begin();
  memcpy(pos, digits.begin(), digits.size());
  pos += digits.size();
  KJ_IF_SOME(f, fraction) {
    *pos++ = '.';
    memcpy(pos, f.begin(), f.size());
    pos += f.size();
  }
  KJ_IF_SOME(e, exponent) {
    *pos++ = 'e';
    KJ_IF_SOME(sign, get<0>(e)) {
      *pos++ = sign;
    }
    memcpy(pos, get<1>(e).begin(), get<1>(e).size());
    pos += get<1>(e).size();
  }

  *pos++ = '\0';
  KJ_DASSERT(pos == buf.end());

  // The above construction should always produce a valid double, so this should never throw...
  return StringPtr(buf.begin(), bufSize).parseAs<double>();
}